

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_addsessionid(connectdata *conn,void *ssl_sessionid,size_t idsize,int sockindex)

{
  Curl_easy *pCVar1;
  _Bool _Var2;
  ssl_primary_config *source;
  char *pcVar3;
  bool bVar4;
  int local_a8;
  char *local_a0;
  byte local_81;
  ssl_primary_config *ssl_config;
  long *plStack_70;
  _Bool isProxy;
  long *general_age;
  char *pcStack_60;
  int conn_to_port;
  char *clone_conn_to_host;
  char *clone_host;
  long oldest_age;
  curl_ssl_session *store;
  Curl_easy *data;
  size_t i;
  int sockindex_local;
  size_t idsize_local;
  void *ssl_sessionid_local;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  oldest_age = (long)(pCVar1->state).session;
  clone_host = (char *)((pCVar1->state).session)->age;
  local_81 = 0;
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    local_81 = (conn->bits).proxy_ssl_connected[sockindex] ^ 0xff;
  }
  if ((local_81 & 1) == 0) {
    source = &conn->ssl_config;
    local_a0 = (conn->host).name;
  }
  else {
    source = &conn->proxy_ssl_config;
    local_a0 = (conn->http_proxy).host.name;
  }
  pcVar3 = (*Curl_cstrdup)(local_a0);
  if (pcVar3 == (char *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    if ((*(uint *)&(conn->bits).field_0x4 >> 3 & 1) == 0) {
      pcStack_60 = (char *)0x0;
    }
    else {
      pcStack_60 = (*Curl_cstrdup)((conn->conn_to_host).name);
      if (pcStack_60 == (char *)0x0) {
        (*Curl_cfree)(pcVar3);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    if ((*(uint *)&(conn->bits).field_0x4 >> 4 & 1) == 0) {
      general_age._4_4_ = -1;
    }
    else {
      general_age._4_4_ = conn->conn_to_port;
    }
    if ((pCVar1->share == (Curl_share *)0x0) || ((pCVar1->share->specifier & 0x10) == 0)) {
      plStack_70 = &(pCVar1->state).sessionage;
    }
    else {
      plStack_70 = &pCVar1->share->sessionage;
    }
    data = (Curl_easy *)0x1;
    while( true ) {
      bVar4 = false;
      if (data < (Curl_easy *)(pCVar1->set).general_ssl.max_ssl_sessions) {
        bVar4 = (pCVar1->state).session[(long)data].sessionid != (void *)0x0;
      }
      if (!bVar4) break;
      if ((pCVar1->state).session[(long)data].age < (long)clone_host) {
        clone_host = (char *)(pCVar1->state).session[(long)data].age;
        oldest_age = (long)((pCVar1->state).session + (long)data);
      }
      data = (Curl_easy *)((long)&data->next + 1);
    }
    if (data == (Curl_easy *)(pCVar1->set).general_ssl.max_ssl_sessions) {
      Curl_ssl_kill_session((curl_ssl_session *)oldest_age);
    }
    else {
      oldest_age = (long)((pCVar1->state).session + (long)data);
    }
    *(void **)(oldest_age + 0x18) = ssl_sessionid;
    *(size_t *)(oldest_age + 0x20) = idsize;
    *(long *)(oldest_age + 0x28) = *plStack_70;
    (*Curl_cfree)(*(void **)oldest_age);
    (*Curl_cfree)(*(void **)(oldest_age + 8));
    *(char **)oldest_age = pcVar3;
    *(char **)(oldest_age + 8) = pcStack_60;
    *(int *)(oldest_age + 0x34) = general_age._4_4_;
    if ((local_81 & 1) == 0) {
      local_a8 = conn->remote_port;
    }
    else {
      local_a8 = (int)conn->port;
    }
    *(int *)(oldest_age + 0x30) = local_a8;
    *(char **)(oldest_age + 0x10) = conn->handler->scheme;
    _Var2 = Curl_clone_primary_ssl_config(source,(ssl_primary_config *)(oldest_age + 0x38));
    if (_Var2) {
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      *(undefined8 *)(oldest_age + 0x18) = 0;
      (*Curl_cfree)(pcVar3);
      (*Curl_cfree)(pcStack_60);
      conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_ssl_addsessionid(struct connectdata *conn,
                               void *ssl_sessionid,
                               size_t idsize,
                               int sockindex)
{
  size_t i;
  struct Curl_easy *data = conn->data; /* the mother of all structs */
  struct curl_ssl_session *store = &data->state.session[0];
  long oldest_age = data->state.session[0].age; /* zero if unused */
  char *clone_host;
  char *clone_conn_to_host;
  int conn_to_port;
  long *general_age;
  const bool isProxy = CONNECT_PROXY_SSL();
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;

  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  clone_host = strdup(isProxy ? conn->http_proxy.host.name : conn->host.name);
  if(!clone_host)
    return CURLE_OUT_OF_MEMORY; /* bail out */

  if(conn->bits.conn_to_host) {
    clone_conn_to_host = strdup(conn->conn_to_host.name);
    if(!clone_conn_to_host) {
      free(clone_host);
      return CURLE_OUT_OF_MEMORY; /* bail out */
    }
  }
  else
    clone_conn_to_host = NULL;

  if(conn->bits.conn_to_port)
    conn_to_port = conn->conn_to_port;
  else
    conn_to_port = -1;

  /* Now we should add the session ID and the host name to the cache, (remove
     the oldest if necessary) */

  /* If using shared SSL session, lock! */
  if(SSLSESSION_SHARED(data)) {
    general_age = &data->share->sessionage;
  }
  else {
    general_age = &data->state.sessionage;
  }

  /* find an empty slot for us, or find the oldest */
  for(i = 1; (i < data->set.general_ssl.max_ssl_sessions) &&
        data->state.session[i].sessionid; i++) {
    if(data->state.session[i].age < oldest_age) {
      oldest_age = data->state.session[i].age;
      store = &data->state.session[i];
    }
  }
  if(i == data->set.general_ssl.max_ssl_sessions)
    /* cache is full, we must "kill" the oldest entry! */
    Curl_ssl_kill_session(store);
  else
    store = &data->state.session[i]; /* use this slot */

  /* now init the session struct wisely */
  store->sessionid = ssl_sessionid;
  store->idsize = idsize;
  store->age = *general_age;    /* set current age */
  /* free it if there's one already present */
  free(store->name);
  free(store->conn_to_host);
  store->name = clone_host;               /* clone host name */
  store->conn_to_host = clone_conn_to_host; /* clone connect to host name */
  store->conn_to_port = conn_to_port; /* connect to port number */
  /* port number */
  store->remote_port = isProxy ? (int)conn->port : conn->remote_port;
  store->scheme = conn->handler->scheme;

  if(!Curl_clone_primary_ssl_config(ssl_config, &store->ssl_config)) {
    store->sessionid = NULL; /* let caller free sessionid */
    free(clone_host);
    free(clone_conn_to_host);
    return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}